

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

shared_ptr<IWaterConsumer> __thiscall
cinject::
CastInstanceRetriever<Human,_IWaterConsumer,_cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
::forwardInstance(CastInstanceRetriever<Human,_IWaterConsumer,_cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
                  *this,InjectionContext *context)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IWaterConsumer> sVar2;
  shared_ptr<Human> local_30;
  undefined8 local_20;
  InjectionContext *context_local;
  CastInstanceRetriever<Human,_IWaterConsumer,_cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
  *this_local;
  
  local_20 = in_RDX;
  context_local = context;
  this_local = this;
  peVar1 = std::
           __shared_ptr_access<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&context->componentStack_);
  (**peVar1->_vptr_InstanceStorage)(&local_30,peVar1,local_20);
  std::dynamic_pointer_cast<IWaterConsumer,Human>((shared_ptr<Human> *)this);
  std::shared_ptr<Human>::~shared_ptr(&local_30);
  sVar2.super___shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<IWaterConsumer>)
         sVar2.super___shared_ptr<IWaterConsumer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TInterface> forwardInstance(InjectionContext* context) override
    {
        return std::dynamic_pointer_cast<TInterface>(storage_->getInstance(context));
    }